

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

int __thiscall Snes_Spc::init(Snes_Spc *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  int n;
  int i;
  uint in_stack_fffffffffffffff0;
  int iVar2;
  
  memset(&this->m,0,0x10468);
  Spc_Dsp::init(&this->dsp,(EVP_PKEY_CTX *)(this->m).ram.ram);
  (this->m).tempo = 0x100;
  (this->m).rom[0x3e] = 0xff;
  (this->m).rom[0x3f] = 0xc0;
  for (iVar2 = 0; iVar2 < 0x80; iVar2 = iVar2 + 1) {
    bVar1 = init::cycle_table[iVar2];
    in_stack_fffffffffffffff0 = (uint)bVar1;
    (this->m).cycle_table[iVar2 << 1] = (uchar)((int)in_stack_fffffffffffffff0 >> 4);
    (this->m).cycle_table[iVar2 * 2 + 1] = bVar1 & 0xf;
  }
  memcpy(this->reg_times,reg_times_,0x100);
  reset((Snes_Spc *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  return 0;
}

Assistant:

blargg_err_t Snes_Spc::init()
{
	memset( &m, 0, sizeof m );
	dsp.init( RAM );
	
	m.tempo = tempo_unit;
	
	// Most SPC music doesn't need ROM, and almost all the rest only rely
	// on these two bytes
	m.rom [0x3E] = 0xFF;
	m.rom [0x3F] = 0xC0;
	
	static unsigned char const cycle_table [128] =
	{//   01   23   45   67   89   AB   CD   EF
	    0x28,0x47,0x34,0x36,0x26,0x54,0x54,0x68, // 0
	    0x48,0x47,0x45,0x56,0x55,0x65,0x22,0x46, // 1
	    0x28,0x47,0x34,0x36,0x26,0x54,0x54,0x74, // 2
	    0x48,0x47,0x45,0x56,0x55,0x65,0x22,0x38, // 3
	    0x28,0x47,0x34,0x36,0x26,0x44,0x54,0x66, // 4
	    0x48,0x47,0x45,0x56,0x55,0x45,0x22,0x43, // 5
	    0x28,0x47,0x34,0x36,0x26,0x44,0x54,0x75, // 6
	    0x48,0x47,0x45,0x56,0x55,0x55,0x22,0x36, // 7
	    0x28,0x47,0x34,0x36,0x26,0x54,0x52,0x45, // 8
	    0x48,0x47,0x45,0x56,0x55,0x55,0x22,0xC5, // 9
	    0x38,0x47,0x34,0x36,0x26,0x44,0x52,0x44, // A
	    0x48,0x47,0x45,0x56,0x55,0x55,0x22,0x34, // B
	    0x38,0x47,0x45,0x47,0x25,0x64,0x52,0x49, // C
	    0x48,0x47,0x56,0x67,0x45,0x55,0x22,0x83, // D
	    0x28,0x47,0x34,0x36,0x24,0x53,0x43,0x40, // E
	    0x48,0x47,0x45,0x56,0x34,0x54,0x22,0x60, // F
	};
	
	// unpack cycle table
	for ( int i = 0; i < 128; i++ )
	{
		int n = cycle_table [i];
		m.cycle_table [i * 2 + 0] = n >> 4;
		m.cycle_table [i * 2 + 1] = n & 0x0F;
	}
	
	#if SPC_LESS_ACCURATE
		memcpy( reg_times, reg_times_, sizeof reg_times );
	#endif
	
	reset();
	return 0;
}